

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes_llvm_builtins.cpp
# Opt level: O0

AllocaTrackedIndex *
dxil_spv::gep_pointer_to_alloca_tracked_inst
          (AllocaTrackedIndex *__return_storage_ptr__,Impl *impl,Value *ptr)

{
  bool bVar1;
  GetElementPtrInst *this;
  Value *pVVar2;
  pointer ppVar3;
  _Node_iterator_base<std::pair<const_LLVMBC::AllocaInst_*const,_dxil_spv::AllocaCBVForwardingTracking>,_false>
  local_38;
  _Node_iterator_base<std::pair<const_LLVMBC::AllocaInst_*const,_dxil_spv::AllocaCBVForwardingTracking>,_false>
  local_30;
  iterator itr;
  AllocaInst *alloca_inst;
  GetElementPtrInst *gep_inst;
  Value *ptr_local;
  Impl *impl_local;
  
  this = LLVMBC::dyn_cast<LLVMBC::GetElementPtrInst>(ptr);
  if (this != (GetElementPtrInst *)0x0) {
    pVVar2 = LLVMBC::Instruction::getOperand(&this->super_Instruction,0);
    itr.
    super__Node_iterator_base<std::pair<const_LLVMBC::AllocaInst_*const,_dxil_spv::AllocaCBVForwardingTracking>,_false>
    ._M_cur = (_Node_iterator_base<std::pair<const_LLVMBC::AllocaInst_*const,_dxil_spv::AllocaCBVForwardingTracking>,_false>
               )LLVMBC::dyn_cast<LLVMBC::AllocaInst>(pVVar2);
    if (itr.
        super__Node_iterator_base<std::pair<const_LLVMBC::AllocaInst_*const,_dxil_spv::AllocaCBVForwardingTracking>,_false>
        ._M_cur != (__node_type *)0x0) {
      local_30._M_cur =
           (__node_type *)
           std::
           unordered_map<const_LLVMBC::AllocaInst_*,_dxil_spv::AllocaCBVForwardingTracking,_std::hash<const_LLVMBC::AllocaInst_*>,_std::equal_to<const_LLVMBC::AllocaInst_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::AllocaInst_*const,_dxil_spv::AllocaCBVForwardingTracking>_>_>
           ::find(&impl->alloca_tracking,(key_type *)&itr);
      local_38._M_cur =
           (__node_type *)
           std::
           unordered_map<const_LLVMBC::AllocaInst_*,_dxil_spv::AllocaCBVForwardingTracking,_std::hash<const_LLVMBC::AllocaInst_*>,_std::equal_to<const_LLVMBC::AllocaInst_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::AllocaInst_*const,_dxil_spv::AllocaCBVForwardingTracking>_>_>
           ::end(&impl->alloca_tracking);
      bVar1 = std::__detail::operator!=(&local_30,&local_38);
      if (bVar1) {
        __return_storage_ptr__->alloca_inst =
             (AllocaInst *)
             itr.
             super__Node_iterator_base<std::pair<const_LLVMBC::AllocaInst_*const,_dxil_spv::AllocaCBVForwardingTracking>,_false>
             ._M_cur;
        pVVar2 = LLVMBC::Instruction::getOperand(&this->super_Instruction,2);
        __return_storage_ptr__->index = pVVar2;
        (__return_storage_ptr__->itr).
        super__Node_iterator_base<std::pair<const_LLVMBC::AllocaInst_*const,_dxil_spv::AllocaCBVForwardingTracking>,_false>
        ._M_cur = local_30._M_cur;
        ppVar3 = std::__detail::
                 _Node_iterator<std::pair<const_LLVMBC::AllocaInst_*const,_dxil_spv::AllocaCBVForwardingTracking>,_false,_false>
                 ::operator->((_Node_iterator<std::pair<const_LLVMBC::AllocaInst_*const,_dxil_spv::AllocaCBVForwardingTracking>,_false,_false>
                               *)&local_30);
        __return_storage_ptr__->cbv_handle = (ppVar3->second).cbv_handle;
        return __return_storage_ptr__;
      }
    }
  }
  memset(__return_storage_ptr__,0,0x20);
  std::__detail::
  _Node_iterator<std::pair<const_LLVMBC::AllocaInst_*const,_dxil_spv::AllocaCBVForwardingTracking>,_false,_false>
  ::_Node_iterator(&__return_storage_ptr__->itr);
  return __return_storage_ptr__;
}

Assistant:

static AllocaTrackedIndex gep_pointer_to_alloca_tracked_inst(Converter::Impl &impl, const llvm::Value *ptr)
{
	if (const auto *gep_inst = llvm::dyn_cast<llvm::GetElementPtrInst>(ptr))
	{
		if (const auto *alloca_inst = llvm::dyn_cast<llvm::AllocaInst>(gep_inst->getOperand(0)))
		{
			auto itr = impl.alloca_tracking.find(alloca_inst);
			if (itr != impl.alloca_tracking.end())
				return { alloca_inst, gep_inst->getOperand(2), itr, itr->second.cbv_handle };
		}
	}

	return {};
}